

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsObjectDefinePropertyFull
          (JsValueRef object,JsValueRef key,JsValueRef value,JsValueRef getter,JsValueRef setter,
          bool writable,bool enumerable,bool configurable,bool *result)

{
  anon_class_72_9_6a1c0f69 fn;
  JsErrorCode JVar1;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  bool configurable_local;
  bool enumerable_local;
  JsValueRef pvStack_30;
  bool writable_local;
  JsValueRef setter_local;
  JsValueRef getter_local;
  JsValueRef value_local;
  JsValueRef key_local;
  JsValueRef object_local;
  
  local_32 = enumerable;
  local_33 = configurable;
  fn.key = &result;
  fn.object = &value_local;
  fn.result = (bool **)&getter_local;
  fn.value = &setter_local;
  fn.getter = &stack0xffffffffffffffd0;
  fn.setter = (JsValueRef *)&local_31;
  fn.writable = (bool *)&local_32;
  fn.enumerable = (bool *)&local_33;
  fn.configurable = (bool *)getter;
  local_31 = writable;
  pvStack_30 = setter;
  setter_local = getter;
  getter_local = value;
  value_local = key;
  key_local = object;
  JVar1 = ContextAPIWrapper<false,JsObjectDefinePropertyFull::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API
JsObjectDefinePropertyFull(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _In_opt_ JsValueRef value,
    _In_opt_ JsValueRef getter,
    _In_opt_ JsValueRef setter,
    _In_ bool writable,
    _In_ bool enumerable,
    _In_ bool configurable,
    _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(key, scriptContext);
        PARAM_NOT_NULL(result);
        *result = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(key), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Js::PropertyDescriptor propertyDescriptor;
        if (value)
        {
            propertyDescriptor.SetValue(value);
        }
        if (getter)
        {
            propertyDescriptor.SetGetter(getter);
        }
        if (setter)
        {
            propertyDescriptor.SetSetter(setter);
        }
        if (writable)
        {
            propertyDescriptor.SetWritable(writable);
        }
        if (enumerable)
        {
            propertyDescriptor.SetEnumerable(enumerable);
        }
        if (configurable)
        {
            propertyDescriptor.SetConfigurable(configurable);
        }

        *result = Js::JavascriptOperators::DefineOwnPropertyDescriptor(
            Js::VarTo<Js::RecyclableObject>(object), propertyRecord->GetPropertyId(),
            propertyDescriptor, true, scriptContext) != 0;
        return JsNoError;
    });
}